

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O3

void __thiscall
HighsDomain::ConflictSet::conflictAnalysis
          (ConflictSet *this,HighsInt *proofinds,double *proofvals,HighsInt prooflen,double proofrhs
          ,HighsConflictPool *conflictPool)

{
  set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
  *this_00;
  pointer ppVar1;
  double dVar2;
  int iVar3;
  pointer pLVar4;
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var5;
  bool bVar6;
  HighsInt HVar7;
  HighsDomain *pHVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  pointer pLVar13;
  vector<double,_std::allocator<double>_> *pvVar14;
  long lVar15;
  int depthLevel;
  pointer __v;
  int iVar16;
  int iVar17;
  HighsInt ninfmin;
  HighsCDouble activitymin;
  _Alloc_node local_50;
  int local_44;
  HighsCDouble local_40;
  
  std::
  vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
  ::reserve(&this->resolvedDomainChanges,
            (long)(this->localdom->domchgstack_).
                  super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->localdom->domchgstack_).
                  super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
                  super__Vector_impl_data._M_start >> 4);
  computeMinActivity(this->globaldom,0,prooflen,proofinds,proofvals,&local_44,&local_40);
  if ((local_44 == 0) &&
     (bVar6 = explainInfeasibilityLeq
                        (this,proofinds,proofvals,prooflen,proofrhs,local_40.hi + local_40.lo),
     bVar6)) {
    HighsPseudocost::increaseConflictWeight
              (&((this->localdom->mipsolver->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->pseudocost);
    __v = (this->resolvedDomainChanges).
          super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
          ._M_impl.super__Vector_impl_data._M_start;
    pLVar4 = (this->resolvedDomainChanges).
             super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (__v != pLVar4) {
      _Var5._M_head_impl =
           (this->localdom->mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
      pLVar13 = __v;
      do {
        pvVar14 = (vector<double,_std::allocator<double>_> *)
                  ((long)&(_Var5._M_head_impl)->pseudocost + 0xf0);
        if ((pLVar13->domchg).boundtype != kLower) {
          pvVar14 = (vector<double,_std::allocator<double>_> *)
                    ((long)&(_Var5._M_head_impl)->pseudocost + 0x108);
        }
        lVar15 = (long)(pLVar13->domchg).column;
        *(double *)
         (*(long *)&pvVar14->super__Vector_base<double,_std::allocator<double>_> + lVar15 * 8) =
             *(double *)((long)&(_Var5._M_head_impl)->pseudocost + 0x120) +
             *(double *)
              (*(long *)&pvVar14->super__Vector_base<double,_std::allocator<double>_> + lVar15 * 8);
        *(double *)((long)&(_Var5._M_head_impl)->pseudocost + 0x128) =
             *(double *)((long)&(_Var5._M_head_impl)->pseudocost + 0x120) +
             *(double *)((long)&(_Var5._M_head_impl)->pseudocost + 0x128);
        pLVar13 = pLVar13 + 1;
      } while (pLVar13 != pLVar4);
    }
    pHVar8 = this->localdom;
    _Var5._M_head_impl =
         (pHVar8->mipsolver->mipdata_)._M_t.
         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
         super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    uVar10 = ((long)pLVar4 - (long)__v >> 3) * -0x5555555555555552;
    uVar9 = ((long)*(pointer *)((long)&(_Var5._M_head_impl)->integral_cols + 8) -
             *(long *)&((_Var5._M_head_impl)->integral_cols).
                       super__Vector_base<int,_std::allocator<int>_> >> 2) * 3 + 1000;
    if (uVar10 < uVar9 || uVar10 - uVar9 == 0) {
      this_00 = &this->reasonSideFrontier;
      local_50._M_t = &this_00->_M_t;
      if (__v != pLVar4) {
        do {
          std::
          _Rb_tree<HighsDomain::ConflictSet::LocalDomChg,HighsDomain::ConflictSet::LocalDomChg,std::_Identity<HighsDomain::ConflictSet::LocalDomChg>,std::less<HighsDomain::ConflictSet::LocalDomChg>,std::allocator<HighsDomain::ConflictSet::LocalDomChg>>
          ::
          _M_insert_unique_<HighsDomain::ConflictSet::LocalDomChg&,std::_Rb_tree<HighsDomain::ConflictSet::LocalDomChg,HighsDomain::ConflictSet::LocalDomChg,std::_Identity<HighsDomain::ConflictSet::LocalDomChg>,std::less<HighsDomain::ConflictSet::LocalDomChg>,std::allocator<HighsDomain::ConflictSet::LocalDomChg>>::_Alloc_node>
                    ((_Rb_tree<HighsDomain::ConflictSet::LocalDomChg,HighsDomain::ConflictSet::LocalDomChg,std::_Identity<HighsDomain::ConflictSet::LocalDomChg>,std::less<HighsDomain::ConflictSet::LocalDomChg>,std::allocator<HighsDomain::ConflictSet::LocalDomChg>>
                      *)this_00,
                     (const_iterator)&(this->reasonSideFrontier)._M_t._M_impl.super__Rb_tree_header,
                     __v,&local_50);
          __v = __v + 1;
        } while (__v != pLVar4);
        pHVar8 = this->localdom;
      }
      uVar9 = (ulong)((long)(pHVar8->branchPos_).super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(pHVar8->branchPos_).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 2;
      if (-1 < (int)(uint)uVar9) {
        uVar12 = (uint)uVar9 & 0x7fffffff;
        iVar11 = -uVar12;
        iVar17 = 0;
        uVar10 = (ulong)uVar12;
        do {
          iVar16 = (int)uVar9;
          depthLevel = (int)uVar10;
          if (uVar10 == 0) {
LAB_002971d8:
            HVar7 = computeCuts(this,depthLevel,conflictPool);
            if (HVar7 == -1) goto LAB_00297201;
            iVar17 = iVar17 + HVar7;
            if ((iVar17 == 0) || ((3 < iVar11 + iVar16 && (HVar7 == 0)))) goto LAB_00297215;
          }
          else {
            pHVar8 = this->localdom;
            iVar3 = (pHVar8->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar10 - 1];
            dVar2 = (pHVar8->domchgstack_).
                    super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                    _M_impl.super__Vector_impl_data._M_start[iVar3].boundval;
            ppVar1 = (pHVar8->prevboundval_).
                     super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + iVar3;
            if ((dVar2 != ppVar1->first) || (NAN(dVar2) || NAN(ppVar1->first))) goto LAB_002971d8;
LAB_00297201:
            uVar9 = (ulong)(iVar16 - 1);
          }
          iVar16 = (int)uVar9;
          iVar11 = iVar11 + 1;
          bVar6 = 0 < (long)uVar10;
          uVar10 = uVar10 - 1;
        } while (bVar6);
        depthLevel = -1;
LAB_00297215:
        if (depthLevel != iVar16) {
          return;
        }
      }
      HighsConflictPool::addConflictCut(conflictPool,this->localdom,this_00);
    }
  }
  return;
}

Assistant:

void HighsDomain::ConflictSet::conflictAnalysis(
    const HighsInt* proofinds, const double* proofvals, HighsInt prooflen,
    double proofrhs, HighsConflictPool& conflictPool) {
  resolvedDomainChanges.reserve(localdom.domchgstack_.size());

  HighsInt ninfmin;
  HighsCDouble activitymin;
  globaldom.computeMinActivity(0, prooflen, proofinds, proofvals, ninfmin,
                               activitymin);
  if (ninfmin != 0) return;

  if (!explainInfeasibilityLeq(proofinds, proofvals, prooflen, proofrhs,
                               double(activitymin)))
    return;

  localdom.mipsolver->mipdata_->pseudocost.increaseConflictWeight();
  for (const LocalDomChg& locdomchg : resolvedDomainChanges) {
    if (locdomchg.domchg.boundtype == HighsBoundType::kLower)
      localdom.mipsolver->mipdata_->pseudocost.increaseConflictScoreUp(
          locdomchg.domchg.column);
    else
      localdom.mipsolver->mipdata_->pseudocost.increaseConflictScoreDown(
          locdomchg.domchg.column);
  }

  if (10 * resolvedDomainChanges.size() >
      1000 + 3 * localdom.mipsolver->mipdata_->integral_cols.size())
    return;

  reasonSideFrontier.insert(resolvedDomainChanges.begin(),
                            resolvedDomainChanges.end());

  assert(resolvedDomainChanges.size() == reasonSideFrontier.size());

  localdom.mipsolver->mipdata_->debugSolution.checkConflictReasonFrontier(
      reasonSideFrontier, localdom.domchgstack_);

  HighsInt numConflicts = 0;
  HighsInt lastDepth = localdom.branchPos_.size();
  HighsInt currDepth;
  for (currDepth = lastDepth; currDepth >= 0; --currDepth) {
    if (currDepth > 0) {
      // skip redundant branching changes which are just added for symmetry
      // handling
      HighsInt branchpos = localdom.branchPos_[currDepth - 1];
      if (localdom.domchgstack_[branchpos].boundval ==
          localdom.prevboundval_[branchpos].first) {
        --lastDepth;
        continue;
      }
    }
    HighsInt numNewConflicts = computeCuts(currDepth, conflictPool);
    // if the depth level was empty, do not consider it
    if (numNewConflicts == -1) {
      --lastDepth;
      continue;
    }

    numConflicts += numNewConflicts;
    // if no conflict was found in the first non-empty depth level we stop here
    if (numConflicts == 0) break;
    // if no conflict was found in this depth level and all conflicts of the
    // first 5 non-empty depth levels are generated we stop here
    if (lastDepth - currDepth >= 4 && numNewConflicts == 0) break;
  }

  // if we stopped in the highest non-empty depth it means no conflicts where
  // added yet. We want to at least add the current conflict frontier as it
  // means the bound change leading to infeasibility was the last branching
  // itself and hence should have been propagated in the previous depth but was
  // not, e.g. because the threshold for an integral variable was not reached.
  if (currDepth == lastDepth)
    conflictPool.addConflictCut(localdom, reasonSideFrontier);
}